

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cpp
# Opt level: O2

unsigned_long dlib::impl::default_num_threads(void)

{
  uint uVar1;
  char *str;
  unsigned_long uVar2;
  
  str = getenv("DLIB_NUM_THREADS");
  if (str == (char *)0x0) {
    uVar1 = std::thread::hardware_concurrency();
    uVar2 = (unsigned_long)uVar1;
  }
  else {
    uVar2 = string_cast<unsigned_long>(str);
  }
  return uVar2;
}

Assistant:

unsigned long default_num_threads()
        {
            try
            {
                char* nt = getenv("DLIB_NUM_THREADS");
                if (nt)
                    return string_cast<unsigned long>(nt);
            } catch(string_cast_error&) {}
            return std::thread::hardware_concurrency();
        }